

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

bool __thiscall
soplex::SoPlexBase<double>::setSettings(SoPlexBase<double> *this,Settings *newSettings,bool init)

{
  bool bVar1;
  Settings *in_RSI;
  long in_RDI;
  int i_2;
  int i_1;
  int i;
  bool success;
  bool in_stack_00000037;
  Real in_stack_00000038;
  RealParam in_stack_00000044;
  SoPlexBase<double> *in_stack_00000048;
  bool in_stack_00000052;
  bool in_stack_00000053;
  BoolParam in_stack_00000054;
  SoPlexBase<double> *in_stack_00000058;
  bool in_stack_0000009f;
  int in_stack_000000a0;
  IntParam in_stack_000000a4;
  SoPlexBase<double> *in_stack_000000a8;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined1 local_12;
  
  local_12 = true;
  Settings::operator=(*(Settings **)(in_RDI + 0x28),in_RSI);
  for (local_18 = 0; local_18 < 0x1a; local_18 = local_18 + 1) {
    bVar1 = setBoolParam(in_stack_00000058,in_stack_00000054,in_stack_00000053,in_stack_00000052);
    local_12 = (local_12 & bVar1) != 0;
  }
  for (local_1c = 0; local_1c < 0x1c; local_1c = local_1c + 1) {
    bVar1 = setIntParam(in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,in_stack_0000009f);
    local_12 = (local_12 & bVar1) != 0;
  }
  for (local_20 = 0; local_20 < 0x1b; local_20 = local_20 + 1) {
    bVar1 = setRealParam(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000037);
    local_12 = (local_12 & bVar1) != 0;
  }
  return local_12;
}

Assistant:

bool SoPlexBase<R>::setSettings(const Settings& newSettings, const bool init)
{
   assert(init || _isConsistent());

   bool success = true;

   *_currentSettings = newSettings;

   for(int i = 0; i < SoPlexBase<R>::BOOLPARAM_COUNT; i++)
      success &= setBoolParam((BoolParam)i, _currentSettings->_boolParamValues[i], init);

   for(int i = 0; i < SoPlexBase<R>::INTPARAM_COUNT; i++)
      success &= setIntParam((IntParam)i, _currentSettings->_intParamValues[i], init);

   for(int i = 0; i < SoPlexBase<R>::REALPARAM_COUNT; i++)
      success &= setRealParam((RealParam)i, _currentSettings->_realParamValues[i], init);

#ifdef SOPLEX_WITH_RATIONALPARAM

   for(int i = 0; i < SoPlexBase<R>::RATIONALPARAM_COUNT; i++)
      success &= setRationalParam((RationalParam)i, _currentSettings->_rationalParamValues[i], init);

#endif

   assert(_isConsistent());

   return success;
}